

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LoopPeeling::GetIteratorUpdateOperations
          (LoopPeeling *this,Loop *loop,Instruction *iterator,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *operations)

{
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *this_00;
  pair<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_bool> pVar1;
  anon_class_32_4_d87ba59f local_80;
  function<void_(unsigned_int_*)> local_60;
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> local_40;
  undefined1 local_38;
  DefUseManager *local_30;
  DefUseManager *def_use_mgr;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *operations_local;
  Instruction *iterator_local;
  Loop *loop_local;
  LoopPeeling *this_local;
  
  def_use_mgr = (DefUseManager *)operations;
  operations_local =
       (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        *)iterator;
  iterator_local = (Instruction *)loop;
  loop_local = (Loop *)this;
  local_30 = IRContext::get_def_use_mgr(this->context_);
  pVar1 = std::
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          ::insert((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                    *)def_use_mgr,(value_type *)&operations_local);
  this_00 = operations_local;
  local_40._M_cur =
       (__node_type *)
       pVar1.first.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  local_38 = pVar1.second;
  local_80.def_use_mgr = local_30;
  local_80.loop = (Loop *)iterator_local;
  local_80.operations =
       (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        *)def_use_mgr;
  local_80.this = this;
  std::function<void(unsigned_int*)>::
  function<spvtools::opt::LoopPeeling::GetIteratorUpdateOperations(spvtools::opt::Loop_const*,spvtools::opt::Instruction*,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>*)::__0,void>
            ((function<void(unsigned_int*)> *)&local_60,&local_80);
  Instruction::ForEachInId((Instruction *)this_00,&local_60);
  std::function<void_(unsigned_int_*)>::~function(&local_60);
  return;
}

Assistant:

void LoopPeeling::GetIteratorUpdateOperations(
    const Loop* loop, Instruction* iterator,
    std::unordered_set<Instruction*>* operations) {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();
  operations->insert(iterator);
  iterator->ForEachInId([def_use_mgr, loop, operations, this](uint32_t* id) {
    Instruction* insn = def_use_mgr->GetDef(*id);
    if (insn->opcode() == spv::Op::OpLabel) {
      return;
    }
    if (operations->count(insn)) {
      return;
    }
    if (!loop->IsInsideLoop(insn)) {
      return;
    }
    GetIteratorUpdateOperations(loop, insn, operations);
  });
}